

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

size_t utf8_string_length(utf8_char_t *data,utf8_size_t size)

{
  size_t sVar1;
  long lVar2;
  
  if (size == 0) {
    size = utf8_char_count(data,0);
  }
  sVar1 = 0;
  while( true ) {
    if (size == 0) {
      return sVar1;
    }
    if (((byte *)data == (byte *)0x0) || (*data == 0)) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)((long)utf8_char_length::_utf8_char_length +
                       (ulong)((byte)*data & 0xfffffff8));
    }
    if (lVar2 == 0) break;
    data = (utf8_char_t *)((byte *)data + lVar2);
    sVar1 = sVar1 + lVar2;
    size = size - 1;
  }
  return sVar1;
}

Assistant:

size_t utf8_string_length(const utf8_char_t* data, utf8_size_t size)
{
    size_t char_length, byts = 0;

    if (0 == size) {
        size = utf8_char_count(data, 0);
    }

    for (; 0 < size; --size) {
        if (0 == (char_length = utf8_char_length(data))) {
            break;
        }

        data += char_length;
        byts += char_length;
    }

    return byts;
}